

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

Data * __thiscall
QTzTimeZonePrivate::previousTransition(QTzTimeZonePrivate *this,qint64 beforeMSecsSinceEpoch)

{
  QTzTransitionTime tran;
  QTzTransitionTime tran_00;
  bool bVar1;
  QTzTransitionTime *pQVar2;
  const_iterator cVar3;
  const_iterator *this_00;
  QTzTimeZonePrivate *this_01;
  QList<QTzTransitionTime> *this_02;
  const_iterator other;
  const_iterator *this_03;
  long in_RDX;
  QTzTimeZonePrivate *in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  const_iterator last;
  const_iterator it;
  QList<QTimeZonePrivate::Data> posixTrans;
  Data *in_stack_fffffffffffffec8;
  Data *in_stack_fffffffffffffed0;
  QList<QTzTransitionTime> *in_stack_fffffffffffffed8;
  QTzTimeZonePrivate *in_stack_fffffffffffffee0;
  qint64 in_stack_fffffffffffffee8;
  anon_class_8_1_87d0aebf in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  anon_class_8_1_87d0aebf in_stack_ffffffffffffff00;
  const_iterator __first;
  const_iterator in_stack_ffffffffffffff08;
  const_iterator in_stack_ffffffffffffff10;
  qint64 in_stack_ffffffffffffff30;
  QTzTimeZonePrivate *in_stack_ffffffffffffff38;
  const_iterator local_50;
  qint64 local_48;
  undefined8 uStack_40;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x74f2db);
  if (bVar1) {
LAB_0074f50f:
    local_50.i = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
    tranCache(in_RSI);
    QList<QTzTransitionTime>::cbegin((QList<QTzTransitionTime> *)in_stack_fffffffffffffed0);
    tranCache(in_RSI);
    QList<QTzTransitionTime>::cend((QList<QTzTransitionTime> *)in_stack_fffffffffffffed0);
    local_50 = std::
               partition_point<QList<QTzTransitionTime>::const_iterator,QTzTimeZonePrivate::previousTransition(long_long)const::__1>
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          in_stack_ffffffffffffff00);
    tranCache(in_RSI);
    other = QList<QTzTransitionTime>::cbegin((QList<QTzTransitionTime> *)in_stack_fffffffffffffed0);
    bVar1 = QList<QTzTransitionTime>::const_iterator::operator>(&local_50,other);
    if (bVar1) {
      this_03 = QList<QTzTransitionTime>::const_iterator::operator--(&local_50);
      QList<QTzTransitionTime>::const_iterator::operator*(this_03);
      tran_00._8_8_ = in_stack_fffffffffffffef0.beforeMSecsSinceEpoch;
      tran_00.atMSecsSinceEpoch = in_stack_fffffffffffffee8;
      dataForTzTransition(in_stack_fffffffffffffee0,tran_00);
    }
    else {
      QTimeZonePrivate::Data::Data(in_stack_fffffffffffffed0);
    }
  }
  else {
    tranCache(in_RSI);
    bVar1 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x74f2f5);
    if (!bVar1) {
      tranCache(in_RSI);
      pQVar2 = QList<QTzTransitionTime>::last(in_stack_fffffffffffffed8);
      if (in_RDX <= pQVar2->atMSecsSinceEpoch) goto LAB_0074f50f;
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    __first.i = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_30.i = __first.i;
    QList<QTimeZonePrivate::Data>::cbegin
              ((QList<QTimeZonePrivate::Data> *)in_stack_fffffffffffffed0);
    QList<QTimeZonePrivate::Data>::cend((QList<QTimeZonePrivate::Data> *)in_stack_fffffffffffffed0);
    cVar3.i._7_1_ = in_stack_fffffffffffffeff;
    cVar3.i._0_7_ = in_stack_fffffffffffffef8;
    local_30 = std::
               partition_point<QList<QTimeZonePrivate::Data>::const_iterator,QTzTimeZonePrivate::previousTransition(long_long)const::__0>
                         (__first,cVar3,in_stack_fffffffffffffef0);
    cVar3 = QList<QTimeZonePrivate::Data>::cbegin(in_stack_fffffffffffffed0);
    bVar1 = QList<QTimeZonePrivate::Data>::const_iterator::operator>(&local_30,cVar3);
    if (bVar1) {
      this_00 = QList<QTimeZonePrivate::Data>::const_iterator::operator--(&local_30);
      QList<QTimeZonePrivate::Data>::const_iterator::operator*(this_00);
      QTimeZonePrivate::Data::Data(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    else {
      this_01 = (QTzTimeZonePrivate *)tranCache(in_RSI);
      bVar1 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x74f496);
      if (bVar1) {
        QTimeZonePrivate::Data::Data(in_stack_fffffffffffffed0);
      }
      else {
        this_02 = tranCache(in_RSI);
        pQVar2 = QList<QTzTransitionTime>::last(this_02);
        local_48 = pQVar2->atMSecsSinceEpoch;
        uStack_40 = *(undefined8 *)&pQVar2->ruleIndex;
        tran._8_8_ = in_stack_fffffffffffffef0.beforeMSecsSinceEpoch;
        tran.atMSecsSinceEpoch = in_stack_fffffffffffffee8;
        dataForTzTransition(this_01,tran);
      }
    }
    QList<QTimeZonePrivate::Data>::~QList((QList<QTimeZonePrivate::Data> *)0x74f50a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::previousTransition(qint64 beforeMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < beforeMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(beforeMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [beforeMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                       });
        if (it > posixTrans.cbegin())
            return *--it;
        // It fell between the last transition (if any) and the first of the POSIX rule:
        return tranCache().isEmpty() ? Data{} : dataForTzTransition(tranCache().last());
    }

    // Otherwise if we can find a valid tran then use its rule
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [beforeMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                     });
    return last > tranCache().cbegin() ? dataForTzTransition(*--last) : Data{};
}